

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

void __thiscall wirehair::Codec::Substitute(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  PeelRow *pPVar8;
  uint uVar9;
  uint8_t *puVar10;
  uint16_t column_i;
  ulong uVar11;
  uint i;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint8_t *vz;
  short sVar15;
  uint8_t *puVar16;
  ushort auStack_36 [3];
  
  uVar1 = this->_peel_head_rows;
  do {
    if (uVar1 == 0xffff) {
      return;
    }
    pPVar8 = this->_peel_rows;
    puVar16 = this->_recovery_blocks;
    puVar10 = this->_input_blocks;
    uVar2 = this->_mix_count;
    uVar3 = this->_mix_next_prime;
    lVar12 = 1;
    uVar14 = this->_block_bytes;
    uVar4 = pPVar8[uVar1].Marks.Unmarked[0];
    uVar5 = pPVar8[uVar1].Params.MixAdd;
    uVar6 = pPVar8[uVar1].Params.MixFirst;
    uVar9 = (uint)uVar6;
    do {
      uVar9 = ((uVar9 & 0xffff) + (uint)uVar5) % (uint)uVar3;
      if (uVar2 <= uVar9) {
        uVar9 = uVar3 - uVar9;
        uVar13 = uVar9 & 0xffff;
        if (uVar5 < (ushort)uVar9) {
          uVar9 = ((uint)uVar5 * 0x10000 - uVar13) % (uint)uVar5;
        }
        else {
          uVar9 = uVar5 - uVar13;
        }
      }
      auStack_36[lVar12] = (ushort)uVar9;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    vz = puVar16 + uVar4 * uVar14;
    puVar16 = puVar16 + ((uint)uVar6 + (uint)this->_block_count) * uVar14;
    if (this->_block_count - 1 == (uint)uVar1) {
      gf256_addset_mem(vz,puVar16,puVar10 + uVar14 * uVar1,this->_input_final_bytes);
      uVar14 = this->_input_final_bytes;
      memcpy(vz + uVar14,puVar16 + uVar14,(ulong)(this->_block_bytes - uVar14));
    }
    else {
      gf256_addset_mem(vz,puVar16,puVar10 + uVar14 * uVar1,uVar14);
    }
    uVar14 = this->_block_bytes;
    gf256_add2_mem(vz,this->_recovery_blocks +
                      ((uint)auStack_36[1] + (uint)this->_block_count) * uVar14,
                   this->_recovery_blocks +
                   ((uint)auStack_36[2] + (uint)this->_block_count) * uVar14,uVar14);
    uVar2 = pPVar8[uVar1].Params.PeelCount;
    if (1 < uVar2) {
      uVar3 = this->_block_next_prime;
      uVar5 = this->_block_count;
      uVar6 = pPVar8[uVar1].Params.PeelFirst;
      uVar7 = pPVar8[uVar1].Params.PeelAdd;
      uVar14 = (uint)uVar7;
      uVar11 = (ulong)((uint)uVar7 + (uint)uVar6) % (ulong)uVar3;
      if ((uint)uVar5 <= (uint)uVar11) {
        uVar9 = (uint)uVar3 - (uint)uVar11;
        uVar13 = uVar9 & 0xffff;
        if (uVar7 < (ushort)uVar9) {
          uVar11 = (ulong)(uVar14 * 0x10000 - uVar13) % (ulong)uVar14;
        }
        else {
          uVar11 = (ulong)(uVar14 - uVar13);
        }
      }
      puVar16 = this->_recovery_blocks;
      uVar9 = this->_block_bytes;
      if (uVar6 == uVar4) {
        puVar10 = puVar16 + ((uint)uVar11 & 0xffff) * uVar9;
LAB_001066ee:
        gf256_add_mem(vz,puVar10,uVar9);
      }
      else {
        puVar10 = puVar16 + uVar6 * uVar9;
        if ((ushort)uVar11 == uVar4) goto LAB_001066ee;
        gf256_add2_mem(vz,puVar10,puVar16 + ((uint)uVar11 & 0xffff) * uVar9,uVar9);
      }
      sVar15 = uVar2 - 2;
      if (sVar15 != 0) {
        do {
          uVar11 = (ulong)(((uint)uVar11 & 0xffff) + uVar14) % (ulong)uVar3;
          if ((uint)uVar5 <= (uint)uVar11) {
            uVar9 = (uint)uVar3 - (uint)uVar11;
            uVar13 = uVar9 & 0xffff;
            if (uVar7 < (ushort)uVar9) {
              uVar11 = (ulong)(uVar14 * 0x10000 - uVar13) % (ulong)uVar14;
            }
            else {
              uVar11 = (ulong)(uVar14 - uVar13);
            }
          }
          if ((ushort)uVar11 != uVar4) {
            gf256_add_mem(vz,this->_recovery_blocks + ((uint)uVar11 & 0xffff) * this->_block_bytes,
                          this->_block_bytes);
          }
          sVar15 = sVar15 + -1;
        } while (sVar15 != 0);
      }
    }
    uVar1 = pPVar8[uVar1].NextRow;
  } while( true );
}

Assistant:

void Codec::Substitute()
{
    CAT_IF_DUMP(cout << endl << "---- Substitute ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0;)

    PeelRow * GF256_RESTRICT row;

    // For each column that has been peeled:
    for (uint16_t row_i = _peel_head_rows; row_i != LIST_TERM; row_i = row->NextRow)
    {
        row = &_peel_rows[row_i];

        const uint16_t dest_column_i = row->Marks.Result.PeelColumn;
        CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * dest_column_i;

        CAT_IF_DUMP(cout << "Generating column " << dest_column_i << ":";)

        const uint8_t * GF256_RESTRICT input_src = _input_blocks + _block_bytes * row_i;
        CAT_IF_DUMP(cout << " " << row_i << ":[" << (unsigned)input_src[0] << "]";)

        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Set up mixing column generator
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]);

        // If copying from final block:
        if (row_i != _block_count - 1) {
            gf256_addset_mem(dest, src, input_src, _block_bytes);
        }
        else
        {
            gf256_addset_mem(dest, src, input_src, _input_final_bytes);
            memcpy(
                dest + _input_final_bytes,
                src + _input_final_bytes,
                _block_bytes - _input_final_bytes);
        }
        CAT_IF_ROWOP(++rowops;)

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src0 = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src1 = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);

        // Add next two mixing columns in
        gf256_add2_mem(dest, src0, src1, _block_bytes);

        CAT_IF_ROWOP(++rowops;)

        // If at least two peeling columns are set:
        if (row->Params.PeelCount >= 2) // common case:
        {
            PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

            const uint16_t column_0 = iter.GetColumn();
            iter.Iterate();
            const uint16_t column_1 = iter.GetColumn();

            // Common case:
            if (column_0 != dest_column_i)
            {
                CAT_DEBUG_ASSERT(column_0 < _recovery_rows);
                const uint8_t * GF256_RESTRICT peel0 = _recovery_blocks + _block_bytes * column_0;

                // Common case:
                if (column_1 != dest_column_i) {
                    CAT_DEBUG_ASSERT(column_1 < _recovery_rows);
                    gf256_add2_mem(dest, peel0, _recovery_blocks + _block_bytes * column_1, _block_bytes);
                }
                else {
                    gf256_add_mem(dest, peel0, _block_bytes);
                }
            }
            else {
                CAT_DEBUG_ASSERT(column_1 < _recovery_rows);
                gf256_add_mem(dest, _recovery_blocks + _block_bytes * column_1, _block_bytes);
            }
            CAT_IF_ROWOP(++rowops;)

            // For each remaining column:
            while (iter.Iterate())
            {
                const uint16_t column_i = iter.GetColumn();
                CAT_DEBUG_ASSERT(column_i < _recovery_rows);
                const uint8_t * GF256_RESTRICT peel_src = _recovery_blocks + _block_bytes * column_i;

                CAT_IF_DUMP(cout << " " << column_i;)

                // If column is not the solved one:
                if (column_i != dest_column_i)
                {
                    gf256_add_mem(dest, peel_src, _block_bytes);
                    CAT_IF_ROWOP(++rowops;)
                    CAT_IF_DUMP(cout << "[" << (unsigned)peel_src[0] << "]";)
                }
                else {
                    CAT_IF_DUMP(cout << "*";)
                }
            }
        } // end if weight 2

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "Substitute used " << rowops << " row ops = " << rowops / (double)_block_count << "*N" << endl;)
}